

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void ym2610_set_mute_mask(void *chip,UINT32 MuteMask)

{
  undefined1 auVar1 [16];
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar1 = _DAT_001769f0;
  lVar3 = (long)chip + 0x4908;
  lVar4 = 0;
  auVar7 = _DAT_001769e0;
  do {
    auVar6 = auVar7 ^ auVar1;
    if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7ffffffa) {
      *(bool *)lVar3 = (MuteMask >> ((uint)lVar4 & 0x1f) & 1) != 0;
      *(bool *)(lVar3 + 0x198) = (MuteMask >> ((uint)lVar4 + 1 & 0x1f) & 1) != 0;
    }
    lVar4 = lVar4 + 2;
    lVar5 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 2;
    auVar7._8_8_ = lVar5 + 2;
    lVar3 = lVar3 + 0x330;
  } while (lVar4 != 6);
  uVar2 = 7;
  lVar3 = 0;
  auVar6 = _DAT_001769e0;
  do {
    auVar7 = auVar6 ^ auVar1;
    if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7ffffffa) {
      *(bool *)((long)chip + lVar3 + 0x5158) = (MuteMask >> (uVar2 - 1 & 0x1f) & 1) != 0;
      *(bool *)((long)chip + lVar3 + 0x5198) = (MuteMask >> (uVar2 & 0x1f) & 1) != 0;
    }
    lVar4 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 2;
    auVar6._8_8_ = lVar4 + 2;
    lVar3 = lVar3 + 0x80;
    uVar2 = uVar2 + 2;
  } while (lVar3 != 0x180);
  *(byte *)((long)chip + 0x5408) = (byte)(MuteMask >> 0xc) & 1;
  return;
}

Assistant:

void ym2610_set_mute_mask(void *chip, UINT32 MuteMask)
{
	YM2610 *F2610 = (YM2610 *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 6; CurChn ++)
		F2610->CH[CurChn].Muted = (MuteMask >> CurChn) & 0x01;
	for (CurChn = 0; CurChn < 6; CurChn ++)
		F2610->adpcm[CurChn].Muted = (MuteMask >> (CurChn + 6)) & 0x01;
	F2610->MuteDeltaT = (MuteMask >> 12) & 0x01;
	
	return;
}